

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_open(unqlite **ppDB,char *zFilename,uint iMode)

{
  unqlite_vfs *puVar1;
  sxi32 sVar2;
  sxu32 sVar3;
  uint nLen;
  int iVar4;
  int iVar5;
  unqlite *pDb;
  unqlite_kv_methods *pMethods;
  Pager *pPager;
  Page **pSrc;
  jx9 *pBackend;
  uint uVar6;
  Pager *zSrc;
  void *pUserData;
  char *pcVar7;
  ProcRandomSeed xSeed;
  uint uVar8;
  uint uVar9;
  
  *ppDB = (unqlite *)0x0;
  sVar2 = unqliteCoreInitialize();
  if (sVar2 != 0) {
    return sVar2;
  }
  pDb = (unqlite *)SyMemBackendPoolAlloc(&sUnqlMPGlobal.sAllocator,0x118);
  if (pDb == (unqlite *)0x0) {
    return -1;
  }
  SyZero(pDb,0x118);
  uVar8 = 0x101;
  if (iMode != 0) {
    uVar8 = iMode;
  }
  SyMemBackendInitFromParent((SyMemBackend *)pDb,&sUnqlMPGlobal.sAllocator);
  (pDb->sErr).pBlob = (void *)0x0;
  (pDb->sErr).nByte = 0;
  (pDb->sErr).mByte = 0;
  (pDb->sErr).pAllocator = (SyMemBackend *)pDb;
  (pDb->sErr).nFlags = 0;
  puVar1 = sUnqlMPGlobal.pVfs;
  uVar6 = uVar8 & 0xfffffff7 | 0x44;
  if ((uVar8 & 0x10) == 0) {
    uVar6 = uVar8 & 0xfffffff7;
  }
  uVar8 = uVar6 | 2;
  if ((uVar6 & 3) != 0) {
    uVar8 = uVar6;
  }
  if ((uVar8 & 4) == 0) {
    if ((uVar8 & 1) == 0) {
      if ((uVar8 & 2) != 0) {
        uVar8 = uVar8 & 0xfffffef2;
      }
    }
    else {
      uVar8 = uVar8 & 0xfffffff1;
    }
  }
  else {
    uVar8 = uVar8 & 0xfffffef4 | 2;
  }
  if (((zFilename == (char *)0x0) || ((uVar8 & 0x80) != 0)) || (*zFilename == '\0')) {
LAB_0010adc8:
    pMethods = unqliteFindKVStore("mem",3);
    uVar8 = uVar8 | 0x80;
LAB_0010adde:
    if (pMethods == (unqlite_kv_methods *)0x0) {
      unqliteGenError(pDb,"Cannot install a default Key/Value storage engine");
      iVar5 = -0x11;
      goto LAB_0010b002;
    }
  }
  else {
    sVar3 = SyStrlen(zFilename);
    if (sVar3 == 8) {
      pcVar7 = ":memory:";
      sVar3 = 8;
LAB_0010ad96:
      sVar2 = SyStrnicmp(zFilename,pcVar7,sVar3);
      if (sVar2 == 0) goto LAB_0010adc8;
    }
    else if (sVar3 == 5) {
      pcVar7 = ":mem:";
      sVar3 = 5;
      goto LAB_0010ad96;
    }
    pMethods = unqliteFindKVStore("hash",4);
    if (pMethods == (unqlite_kv_methods *)0x0) {
      pMethods = unqliteFindKVStore("btree",5);
      goto LAB_0010adde;
    }
  }
  uVar9 = uVar8 & 0x80;
  uVar6 = 1;
  if (uVar9 == 0) {
    nLen = SyStrlen(zFilename);
    sVar3 = nLen + puVar1->mxPathname + 0x261;
    uVar6 = uVar8 >> 6 & 1;
  }
  else {
    nLen = 0;
    sVar3 = 0x260;
  }
  pPager = (Pager *)SyMemBackendAlloc((SyMemBackend *)pDb,sVar3);
  if (pPager == (Pager *)0x0) {
    iVar5 = -1;
    goto LAB_0010b002;
  }
  SyZero(pPager,sVar3);
  pPager->pAllocator = (SyMemBackend *)pDb;
  pPager->pDb = pDb;
  (pDb->sDB).pPager = pPager;
  pPager->nSize = 0x80;
  pSrc = (Page **)SyMemBackendAlloc((SyMemBackend *)pDb,0x400);
  pPager->apHash = pSrc;
  iVar5 = -1;
  if (pSrc != (Page **)0x0) {
    xSeed = (ProcRandomSeed)&DAT_00000400;
    SyZero(pSrc,0x400);
    pPager->is_mem = uVar9 >> 7;
    pPager->no_jrnl = uVar6;
    pPager->is_rdonly = uVar8 & 1;
    pPager->iOpenFlags = uVar8;
    pPager->pVfs = puVar1;
    SyRandomnessInit(&pPager->sPrng,xSeed,pUserData);
    SyRandomness(&pPager->sPrng,&pPager->cksumInit,4);
    pPager->nCacheMax = 0xffffffff;
    if (uVar9 == 0) {
      zSrc = pPager + 1;
      pPager->zFilename = (char *)zSrc;
      if (puVar1->xFullPathname == (_func_int_unqlite_vfs_ptr_char_ptr_int_char_ptr *)0x0) {
LAB_0010af8d:
        nLen = SyStrlen((char *)zSrc);
      }
      else {
        iVar4 = (*puVar1->xFullPathname)(puVar1,zFilename,puVar1->mxPathname + nLen,(char *)zSrc);
        zSrc = (Pager *)pPager->zFilename;
        if (iVar4 == 0) goto LAB_0010af8d;
        SyMemcpy(zFilename,zSrc,nLen);
        pPager->zFilename[nLen] = '\0';
      }
      pcVar7 = (char *)SyMemBackendAlloc(pPager->pAllocator,nLen + 0x12);
      pPager->zJournal = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_0010aff2;
      SyMemcpy(pPager->zFilename,pcVar7,nLen);
      SyMemcpy("_unqlite_journal",pPager->zJournal + nLen,0x10);
      pPager->zJournal[(ulong)nLen + 0x10] = '\0';
    }
    iVar5 = unqlitePagerRegisterKvEngine(pPager,pMethods);
    if (iVar5 == 0) {
      uVar8 = (uint)(pPager->is_mem != 0);
      pPager->iState = uVar8 * 5;
      pPager->iLock = uVar8 << 2;
      (pDb->sDB).pJx9 = (jx9 *)0x0;
      if (sJx9MPGlobal.nMagic != 0xea1495ba) {
        if (sJx9MPGlobal.pVfs == (jx9_vfs *)0x0) {
          jx9_lib_config(6,&sUnixVfs);
        }
        if ((sJx9MPGlobal.sAllocator.pMethods == (SyMemMethods *)0x0) &&
           (iVar5 = jx9_lib_config(1,0), iVar5 != 0)) goto LAB_0010b002;
        sJx9MPGlobal.nMagic = 0xea1495ba;
      }
      pBackend = (jx9 *)SyMemBackendPoolAlloc(&sJx9MPGlobal.sAllocator,0x118);
      if (pBackend == (jx9 *)0x0) {
        iVar5 = -1;
      }
      else {
        SyZero(pBackend,0x118);
        pBackend->nMagic = 0xf874bcd7;
        iVar5 = SyMemBackendInitFromParent((SyMemBackend *)pBackend,&sJx9MPGlobal.sAllocator);
        if (iVar5 == 0) {
          (pBackend->xConf).sErrConsumer.pBlob = (void *)0x0;
          (pBackend->xConf).sErrConsumer.nByte = 0;
          (pBackend->xConf).sErrConsumer.mByte = 0;
          (pBackend->xConf).sErrConsumer.pAllocator = (SyMemBackend *)pBackend;
          (pBackend->xConf).sErrConsumer.nFlags = 0;
          (pBackend->xConf).xErr = jx9VmBlobConsumer;
          (pBackend->xConf).pErrData = &(pBackend->xConf).sErrConsumer;
          pBackend->pVfs = sJx9MPGlobal.pVfs;
          if (sJx9MPGlobal.pEngines != (jx9 *)0x0) {
            pBackend->pNext = sJx9MPGlobal.pEngines;
            (sJx9MPGlobal.pEngines)->pPrev = pBackend;
          }
          sJx9MPGlobal.nEngine = sJx9MPGlobal.nEngine + 1;
          sJx9MPGlobal.pEngines = pBackend;
          (pDb->sDB).pJx9 = pBackend;
          if (sUnqlMPGlobal.pDB != (unqlite *)0x0) {
            pDb->pNext = sUnqlMPGlobal.pDB;
            (sUnqlMPGlobal.pDB)->pPrev = pDb;
          }
          sUnqlMPGlobal.nDB = sUnqlMPGlobal.nDB + 1;
          sUnqlMPGlobal.pDB = pDb;
          pDb->nMagic = 0xdb7c2712;
          *ppDB = pDb;
          return 0;
        }
        SyMemBackendRelease((SyMemBackend *)pBackend);
        SyMemBackendPoolFree(&sJx9MPGlobal.sAllocator,pBackend);
      }
      goto LAB_0010b002;
    }
  }
LAB_0010aff2:
  SyMemBackendFree((SyMemBackend *)pDb,pPager);
LAB_0010b002:
  SyMemBackendRelease((SyMemBackend *)pDb);
  SyMemBackendPoolFree(&sUnqlMPGlobal.sAllocator,pDb);
  return iVar5;
}

Assistant:

int unqlite_open(unqlite **ppDB,const char *zFilename,unsigned int iMode)
{
	unqlite *pHandle;
	int rc;
#if defined(UNTRUST)
	if( ppDB == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	*ppDB = 0;
	/* One-time automatic library initialization */
	rc = unqliteCoreInitialize();
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Allocate a new database handle */
	pHandle = (unqlite *)SyMemBackendPoolAlloc(&sUnqlMPGlobal.sAllocator, sizeof(unqlite));
	if( pHandle == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pHandle,sizeof(unqlite));
	if( iMode < 1 ){
		/* Assume a read-only database */
		iMode = UNQLITE_OPEN_READONLY|UNQLITE_OPEN_MMAP;
	}
	/* Init the database */
	rc = unqliteInitDatabase(pHandle,&sUnqlMPGlobal.sAllocator,zFilename,iMode);
	if( rc != UNQLITE_OK ){
		goto Release;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	if( !(iMode & UNQLITE_OPEN_NOMUTEX) && (sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE) ){
		 /* Associate a recursive mutex with this instance */
		 pHandle->pMutex = SyMutexNew(sUnqlMPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pHandle->pMutex == 0 ){
			 rc = UNQLITE_NOMEM;
			 goto Release;
		 }
	 }
#endif
	/* Link to the list of active DB handles */
#if defined(UNQLITE_ENABLE_THREADS)
	/* Enter the global mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, sUnqlMPGlobal.pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel == UNQLITE_THREAD_LEVEL_SINGLE */
#endif
	 MACRO_LD_PUSH(sUnqlMPGlobal.pDB,pHandle);
	 sUnqlMPGlobal.nDB++;
#if defined(UNQLITE_ENABLE_THREADS)
	/* Leave the global mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods, sUnqlMPGlobal.pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel == UNQLITE_THREAD_LEVEL_SINGLE */
#endif
	/* Set the magic number to identify a valid DB handle */
	 pHandle->nMagic = UNQLITE_DB_MAGIC;
	/* Make the handle available to the caller */
	*ppDB = pHandle;
	return UNQLITE_OK;
Release:
	SyMemBackendRelease(&pHandle->sMem);
	SyMemBackendPoolFree(&sUnqlMPGlobal.sAllocator,pHandle);
	return rc;
}